

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_uniform_block_active_visitor.cpp
# Opt level: O2

ir_visitor_status __thiscall
link_uniform_block_active_visitor::visit_enter
          (link_uniform_block_active_visitor *this,ir_dereference_array *ir)

{
  ir_node_type iVar1;
  ir_variable *this_00;
  bool bVar2;
  ir_dereference_array *piVar3;
  link_uniform_block_active *block;
  ir_visitor_status iVar4;
  
  piVar3 = ir;
  do {
    piVar3 = (ir_dereference_array *)piVar3->array;
    iVar1 = (piVar3->super_ir_dereference).super_ir_rvalue.super_ir_instruction.ir_type;
  } while (iVar1 == ir_type_dereference_array);
  if (iVar1 == ir_type_dereference_variable) {
    this_00 = (ir_variable *)piVar3->array;
    iVar4 = visit_continue;
    if (this_00 != (ir_variable *)0x0) {
      bVar2 = ir_variable::is_in_buffer_block(this_00);
      if (bVar2) {
        bVar2 = ir_variable::is_interface_instance(this_00);
        iVar4 = visit_continue;
        if (bVar2) {
          block = process_block(this->mem_ctx,this->ht,this_00);
          if (block == (link_uniform_block_active *)0x0) {
            linker_error(this->prog,"uniform block `%s\' has mismatching definitions",
                         this_00->interface_type->name);
            (this->super_ir_hierarchical_visitor).field_0x31 = 0;
            iVar4 = visit_stop;
          }
          else {
            if (block->has_instance_name == false) {
              __assert_fail("b->has_instance_name",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                            ,0xfe,
                            "virtual ir_visitor_status link_uniform_block_active_visitor::visit_enter(ir_dereference_array *)"
                           );
            }
            if (block->type == (glsl_type *)0x0) {
              __assert_fail("b->type != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_uniform_block_active_visitor.cpp"
                            ,0xff,
                            "virtual ir_visitor_status link_uniform_block_active_visitor::visit_enter(ir_dereference_array *)"
                           );
            }
            iVar4 = visit_continue_with_parent;
            if ((*(uint *)&this_00->interface_type->field_0x4 & 0xc00000) == 0x800000) {
              block->var = this_00;
              process_arrays(this->mem_ctx,ir,block);
            }
          }
        }
      }
    }
  }
  else {
    iVar4 = visit_continue;
  }
  return iVar4;
}

Assistant:

ir_visitor_status
link_uniform_block_active_visitor::visit_enter(ir_dereference_array *ir)
{
   /* cycle through arrays of arrays */
   ir_dereference_array *base_ir = ir;
   while (base_ir->array->ir_type == ir_type_dereference_array)
      base_ir = base_ir->array->as_dereference_array();

   ir_dereference_variable *const d =
      base_ir->array->as_dereference_variable();
   ir_variable *const var = (d == NULL) ? NULL : d->var;

   /* If the r-value being dereferenced is not a variable (e.g., a field of a
    * structure) or is not a uniform block instance, continue.
    *
    * WARNING: It is not enough for the variable to be part of uniform block.
    * It must represent the entire block.  Arrays (or matrices) inside blocks
    * that lack an instance name are handled by the ir_dereference_variable
    * function.
    */
   if (var == NULL
       || !var->is_in_buffer_block()
       || !var->is_interface_instance())
      return visit_continue;

   /* Process the block.  Bail if there was an error. */
   link_uniform_block_active *const b =
      process_block(this->mem_ctx, this->ht, var);
   if (b == NULL) {
      linker_error(prog,
                   "uniform block `%s' has mismatching definitions",
                   var->get_interface_type()->name);
      this->success = false;
      return visit_stop;
   }

   /* Block arrays must be declared with an instance name.
    */
   assert(b->has_instance_name);
   assert(b->type != NULL);

   /* If the block array was declared with a shared or std140 layout
    * qualifier, all its instances have been already marked as used in
    * link_uniform_block_active_visitor::visit(ir_variable *).
    */
   if (var->get_interface_type_packing() == GLSL_INTERFACE_PACKING_PACKED) {
      b->var = var;
      process_arrays(this->mem_ctx, ir, b);
   }

   return visit_continue_with_parent;
}